

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Determinant<2>::doExpand
          (Determinant<2> *this,ExpandContext *param_1,ArgExprs *args)

{
  undefined8 *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  int i;
  ExprP<float> EVar1;
  ExprP<tcu::Matrix<float,_2,_2>_> mat;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> local_a8;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_98;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> local_88;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_78;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_68;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> local_58;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_48;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> local_38;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_28;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_> local_18;
  
  mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.super_ExprPBase<tcu::Matrix<float,_2,_2>_>
  .super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_2,_2>_> *)*in_RCX;
  mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.super_ExprPBase<tcu::Matrix<float,_2,_2>_>
  .super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state
       = (SharedPtrStateBase *)in_RCX[1];
  if (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
      m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
    m_state)->strongRefCount =
         (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
         m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
     super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
    m_state)->weakRefCount =
         (mat.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.
         m_state)->weakRefCount + 1;
    UNLOCK();
  }
  i = (int)&mat;
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_38,i);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_28,(int)&local_38);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_58,i);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_48,(int)&local_58);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_18,(ExprP<float> *)&local_28,(ExprP<float> *)&local_48)
  ;
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_88,i);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_78,(int)&local_88);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_a8,i);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_98,(int)&local_a8);
  BuiltinPrecisionTests::operator*
            ((BuiltinPrecisionTests *)&local_68,(ExprP<float> *)&local_78,(ExprP<float> *)&local_98)
  ;
  BuiltinPrecisionTests::operator-
            ((BuiltinPrecisionTests *)this,(ExprP<float> *)&local_18,(ExprP<float> *)&local_68);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_68);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_98);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            (&local_a8);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_78);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            (&local_88);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_18);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_48);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            (&local_58);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>::release(&local_28);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            (&local_38);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>::release
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_> *)
             &mat);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<Ret>	doExpand (ExpandContext&, const ArgExprs& args)	const
	{
		ExprP<Mat2>	mat	= args.a;

		return mat[0][0] * mat[1][1] - mat[1][0] * mat[0][1];
	}